

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void av1_rd_pick_palette_intra_sbuv
               (AV1_COMP *cpi,MACROBLOCK *x,int dc_mode_cost,uint8_t *best_palette_color_map,
               MB_MODE_INFO *best_mbmi,int64_t *best_rd,int *rate,int *rate_tokenonly,
               int64_t *distortion,uint8_t *skippable)

{
  ushort uVar1;
  undefined2 uVar2;
  ulong uVar3;
  byte bVar4;
  undefined2 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ushort *puVar10;
  ushort *puVar11;
  void *in_RCX;
  long in_RSI;
  long in_RDI;
  void *in_R8;
  long *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  long *in_stack_00000018;
  undefined1 *in_stack_00000020;
  int64_t header_rd;
  int palette_mode_rate;
  int temp_v;
  int temp_u;
  int min_val;
  int min_idx;
  int max_colors;
  int colors;
  uint16_t *src_v16;
  uint16_t *src_u16;
  int16_t centroids [16];
  int16_t *data;
  int val_v;
  int ub_v;
  int lb_v;
  int val_u;
  int ub_u;
  int lb_u;
  int max_itr;
  int j;
  int i;
  int n;
  int c;
  int r;
  int n_cache;
  uint16_t color_cache [16];
  int count_buf_1 [256];
  int count_buf_8bit [256];
  int count_buf [4096];
  int cols;
  int rows;
  int plane_block_height;
  int plane_block_width;
  RD_STATS tokenonly_rd_stats;
  uint8_t *color_map;
  uint8_t *src_v;
  uint8_t *src_u;
  int src_stride;
  int colors_threshold;
  int colors_threshold_v;
  int colors_threshold_u;
  int colors_v;
  int colors_u;
  int64_t this_rd;
  int this_rate;
  SequenceHeader *seq_params;
  BLOCK_SIZE bsize;
  PALETTE_MODE_INFO *pmi;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int *cols_within_bounds;
  int *in_stack_ffffffffffffb640;
  int *in_stack_ffffffffffffb648;
  int *in_stack_ffffffffffffb650;
  undefined4 in_stack_ffffffffffffb658;
  undefined4 in_stack_ffffffffffffb65c;
  uint in_stack_ffffffffffffb660;
  int in_stack_ffffffffffffb664;
  int iVar12;
  int in_stack_ffffffffffffb668;
  int in_stack_ffffffffffffb66c;
  uint8_t *in_stack_ffffffffffffb670;
  undefined4 in_stack_ffffffffffffb680;
  undefined4 in_stack_ffffffffffffb684;
  short sVar13;
  undefined4 in_stack_ffffffffffffb688;
  undefined4 in_stack_ffffffffffffb68c;
  undefined4 in_stack_ffffffffffffb690;
  undefined4 in_stack_ffffffffffffb694;
  uint16_t *in_stack_ffffffffffffb698;
  undefined8 in_stack_ffffffffffffb6a0;
  int in_stack_ffffffffffffb6a8;
  undefined4 in_stack_ffffffffffffb6ac;
  MB_MODE_INFO *in_stack_ffffffffffffb6b0;
  MACROBLOCK *in_stack_ffffffffffffb6b8;
  AV1_COMP *in_stack_ffffffffffffb6c0;
  uint local_492c;
  uint local_4928;
  uint local_4924;
  uint local_4920;
  uint local_491c;
  uint uVar14;
  undefined4 uVar15;
  int local_4910;
  int iVar16;
  int n_colors;
  int in_stack_ffffffffffffb6fc;
  int iVar17;
  AV1_COMP *in_stack_ffffffffffffb708;
  int local_44d8 [4354];
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  long local_b8;
  undefined1 local_a0;
  void *local_98;
  byte *local_90;
  byte *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  int local_5c;
  long local_58;
  BLOCK_SIZE local_49;
  BLOCK_SIZE *local_48;
  BLOCK_SIZE *local_40;
  MACROBLOCKD *local_38;
  long *local_30;
  void *local_28;
  void *local_20;
  long local_10;
  long local_8;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffb6a0 >> 0x20);
  local_38 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_40 = (BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x2058);
  local_48 = local_40 + 0x5e;
  local_49 = *local_40;
  local_58 = *(long *)(in_RDI + 0x42008);
  local_74 = 0;
  local_78 = 0;
  local_7c = 0;
  local_80 = *(int *)(in_RSI + 0xd0);
  local_88 = *(byte **)(in_RSI + 0xb8);
  local_90 = *(byte **)(in_RSI + 0x140);
  local_98 = *(void **)(in_RSI + 0xc80);
  cols_within_bounds = &local_d0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  av1_get_block_dimensions(local_49,1,local_38,&local_c4,&local_c8,&local_cc,cols_within_bounds);
  local_40[3] = BLOCK_4X4;
  if (*(char *)(local_58 + 0x4c) == '\0') {
    av1_count_colors(in_stack_ffffffffffffb670,in_stack_ffffffffffffb66c,in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb664,
                     (int *)CONCAT44(in_stack_ffffffffffffb65c,in_stack_ffffffffffffb658),
                     in_stack_ffffffffffffb650);
    av1_count_colors(in_stack_ffffffffffffb670,in_stack_ffffffffffffb66c,in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb664,
                     (int *)CONCAT44(in_stack_ffffffffffffb65c,in_stack_ffffffffffffb658),
                     in_stack_ffffffffffffb650);
    local_74 = local_6c;
    local_78 = local_70;
  }
  else {
    av1_count_colors_highbd
              (in_stack_ffffffffffffb670,in_stack_ffffffffffffb66c,in_stack_ffffffffffffb668,
               in_stack_ffffffffffffb664,in_stack_ffffffffffffb660,
               (int *)CONCAT44(in_stack_ffffffffffffb65c,in_stack_ffffffffffffb658),
               (int *)CONCAT44(in_stack_ffffffffffffb684,in_stack_ffffffffffffb680),
               (int *)CONCAT44(in_stack_ffffffffffffb68c,in_stack_ffffffffffffb688),
               (int *)CONCAT44(in_stack_ffffffffffffb694,in_stack_ffffffffffffb690));
    cols_within_bounds = local_44d8;
    in_stack_ffffffffffffb640 = &local_78;
    in_stack_ffffffffffffb648 = &local_70;
    av1_count_colors_highbd
              (in_stack_ffffffffffffb670,in_stack_ffffffffffffb66c,in_stack_ffffffffffffb668,
               in_stack_ffffffffffffb664,in_stack_ffffffffffffb660,
               (int *)CONCAT44(in_stack_ffffffffffffb65c,in_stack_ffffffffffffb658),
               (int *)CONCAT44(in_stack_ffffffffffffb684,in_stack_ffffffffffffb680),
               (int *)CONCAT44(in_stack_ffffffffffffb68c,in_stack_ffffffffffffb688),
               (int *)CONCAT44(in_stack_ffffffffffffb694,in_stack_ffffffffffffb690));
  }
  iVar6 = av1_get_palette_cache
                    ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffb6ac,in_stack_ffffffffffffb6a8),
                     iVar6,in_stack_ffffffffffffb698);
  local_7c = local_78;
  if (local_78 < local_74) {
    local_7c = local_74;
  }
  if ((1 < local_7c) && (local_7c < 0x41)) {
    uVar15 = 0x32;
    lVar9 = *(long *)(local_10 + 0x41c0) + 0x1000;
    puVar10 = (ushort *)((long)local_88 * 2);
    puVar11 = (ushort *)((long)local_90 * 2);
    if (*(char *)(local_58 + 0x4c) == '\0') {
      uVar7 = (uint)*local_88;
      local_491c = (uint)*local_88;
      local_4924 = (uint)*local_90;
      local_4928 = (uint)*local_90;
    }
    else {
      uVar7 = (uint)*puVar10;
      local_491c = (uint)*puVar10;
      local_4924 = (uint)*puVar11;
      local_4928 = (uint)*puVar11;
    }
    for (iVar17 = 0; iVar17 < local_cc; iVar17 = iVar17 + 1) {
      for (in_stack_ffffffffffffb6fc = 0; in_stack_ffffffffffffb6fc < local_d0;
          in_stack_ffffffffffffb6fc = in_stack_ffffffffffffb6fc + 1) {
        if (*(char *)(local_58 + 0x4c) == '\0') {
          local_4920 = (uint)local_88[iVar17 * local_80 + in_stack_ffffffffffffb6fc];
          bVar4 = local_90[iVar17 * local_80 + in_stack_ffffffffffffb6fc];
          local_492c = (uint)bVar4;
          *(ushort *)(lVar9 + (long)((iVar17 * local_d0 + in_stack_ffffffffffffb6fc) * 2) * 2) =
               (ushort)local_88[iVar17 * local_80 + in_stack_ffffffffffffb6fc];
          *(ushort *)(lVar9 + (long)((iVar17 * local_d0 + in_stack_ffffffffffffb6fc) * 2 + 1) * 2) =
               (ushort)bVar4;
        }
        else {
          local_4920 = (uint)puVar10[iVar17 * local_80 + in_stack_ffffffffffffb6fc];
          uVar1 = puVar11[iVar17 * local_80 + in_stack_ffffffffffffb6fc];
          local_492c = (uint)uVar1;
          *(ushort *)(lVar9 + (long)((iVar17 * local_d0 + in_stack_ffffffffffffb6fc) * 2) * 2) =
               puVar10[iVar17 * local_80 + in_stack_ffffffffffffb6fc];
          *(ushort *)(lVar9 + (long)((iVar17 * local_d0 + in_stack_ffffffffffffb6fc) * 2 + 1) * 2) =
               uVar1;
        }
        uVar14 = local_4920;
        if ((uVar7 <= local_4920) && (uVar14 = uVar7, local_491c < local_4920)) {
          local_491c = local_4920;
        }
        if (local_492c < local_4924) {
          local_4924 = local_492c;
        }
        else if (local_4928 < local_492c) {
          local_4928 = local_492c;
        }
        uVar7 = uVar14;
      }
    }
    iVar12 = local_70;
    if (local_70 < local_6c) {
      iVar12 = local_6c;
    }
    if (8 < iVar12) {
      iVar12 = 8;
    }
    for (n_colors = 2; n_colors <= iVar12; n_colors = n_colors + 1) {
      for (iVar16 = 0; iVar16 < n_colors; iVar16 = iVar16 + 1) {
        uVar3 = (long)(int)((iVar16 * 2 + 1) * (local_491c - uVar7)) / (long)n_colors;
        *(short *)(&stack0xffffffffffffb6a8 + (long)(iVar16 << 1) * 2) =
             (short)uVar7 +
             (short)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 2);
        uVar3 = (long)(int)((iVar16 * 2 + 1) * (local_4928 - local_4924)) / (long)n_colors;
        *(short *)(&stack0xffffffffffffb6a8 + (long)(iVar16 * 2 + 1) * 2) =
             (short)local_4924 +
             (short)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 2);
        in_stack_ffffffffffffb660 = local_4924;
      }
      iVar16 = (int)((ulong)cols_within_bounds >> 0x20);
      cols_within_bounds = (int *)CONCAT44(iVar16,0x32);
      av1_k_means((int16_t *)in_stack_ffffffffffffb650,(int16_t *)in_stack_ffffffffffffb648,
                  (uint8_t *)in_stack_ffffffffffffb640,iVar16,0x32,0,in_stack_ffffffffffffb660);
      optimize_palette_colors
                ((uint16_t *)&stack0xffffffffffffb708,iVar6,n_colors,2,
                 (int16_t *)&stack0xffffffffffffb6a8,*(int *)(*(long *)(local_8 + 0x42008) + 0x48));
      for (iVar16 = 0; SBORROW4(iVar16,(n_colors + -1) * 2) != iVar16 + (n_colors + -1) * -2 < 0;
          iVar16 = iVar16 + 2) {
        sVar13 = *(short *)(&stack0xffffffffffffb6a8 + (long)iVar16 * 2);
        iVar8 = iVar16;
        local_4910 = iVar16;
        while (local_4910 = local_4910 + 2,
              SBORROW4(local_4910,n_colors * 2) != local_4910 + n_colors * -2 < 0) {
          if (*(short *)(&stack0xffffffffffffb6a8 + (long)local_4910 * 2) < sVar13) {
            sVar13 = *(short *)(&stack0xffffffffffffb6a8 + (long)local_4910 * 2);
            iVar8 = local_4910;
          }
        }
        if (iVar8 != iVar16) {
          uVar5 = *(undefined2 *)(&stack0xffffffffffffb6a8 + (long)iVar16 * 2);
          uVar2 = *(undefined2 *)(&stack0xffffffffffffb6a8 + (long)(iVar16 + 1) * 2);
          *(undefined2 *)(&stack0xffffffffffffb6a8 + (long)iVar16 * 2) =
               *(undefined2 *)(&stack0xffffffffffffb6a8 + (long)iVar8 * 2);
          *(undefined2 *)(&stack0xffffffffffffb6a8 + (long)(iVar16 + 1) * 2) =
               *(undefined2 *)(&stack0xffffffffffffb6a8 + (long)(iVar8 + 1) * 2);
          *(undefined2 *)(&stack0xffffffffffffb6a8 + (long)iVar8 * 2) = uVar5;
          *(undefined2 *)(&stack0xffffffffffffb6a8 + (long)(iVar8 + 1) * 2) = uVar2;
        }
      }
      av1_calc_indices((int16_t *)in_stack_ffffffffffffb650,(int16_t *)in_stack_ffffffffffffb648,
                       (uint8_t *)in_stack_ffffffffffffb640,(int)((ulong)cols_within_bounds >> 0x20)
                       ,(int)cols_within_bounds,0);
      extend_palette_color_map
                ((uint8_t *)in_stack_ffffffffffffb650,
                 (int)((ulong)in_stack_ffffffffffffb648 >> 0x20),(int)in_stack_ffffffffffffb648,
                 (int)((ulong)in_stack_ffffffffffffb640 >> 0x20),(int)in_stack_ffffffffffffb640);
      local_48[0x31] = (BLOCK_SIZE)n_colors;
      for (iVar16 = 1; iVar16 < 3; iVar16 = iVar16 + 1) {
        for (local_4910 = 0; local_4910 < n_colors; local_4910 = local_4910 + 1) {
          if (*(char *)(local_58 + 0x4c) == '\0') {
            bVar4 = clip_pixel((int)*(short *)(&stack0xffffffffffffb6a8 +
                                              (long)(local_4910 * 2 + iVar16 + -1) * 2));
            *(ushort *)(local_48 + (long)(iVar16 * 8 + local_4910) * 2) = (ushort)bVar4;
          }
          else {
            uVar5 = clip_pixel_highbd((int)in_stack_ffffffffffffb640,
                                      (int)((ulong)cols_within_bounds >> 0x20));
            *(undefined2 *)(local_48 + (long)(iVar16 * 8 + local_4910) * 2) = uVar5;
          }
        }
      }
      if (*(int *)(local_8 + 0x60bbc) == 0) {
        av1_txfm_uvrd(in_stack_ffffffffffffb708,(MACROBLOCK *)CONCAT44(iVar6,iVar17),
                      (RD_STATS *)CONCAT44(in_stack_ffffffffffffb6fc,n_colors),
                      (BLOCK_SIZE)((uint)iVar16 >> 0x18),CONCAT44(uVar15,uVar7));
        if (local_c0 != 0x7fffffff) {
          iVar16 = local_c0;
          local_5c = intra_mode_info_cost_uv
                               (in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6b8,
                                in_stack_ffffffffffffb6b0,
                                (BLOCK_SIZE)((uint)in_stack_ffffffffffffb6ac >> 0x18),
                                in_stack_ffffffffffffb6a8);
          local_5c = iVar16 + local_5c;
          goto LAB_00271e88;
        }
      }
      else {
        iVar8 = intra_mode_info_cost_uv
                          (in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6b8,
                           in_stack_ffffffffffffb6b0,
                           (BLOCK_SIZE)((uint)in_stack_ffffffffffffb6ac >> 0x18),
                           in_stack_ffffffffffffb6a8);
        if (*local_30 <= (long)iVar8 * (long)*(int *)(local_10 + 0x4218) + 0x100 >> 9) break;
        av1_txfm_uvrd(in_stack_ffffffffffffb708,(MACROBLOCK *)CONCAT44(iVar6,iVar17),
                      (RD_STATS *)CONCAT44(in_stack_ffffffffffffb6fc,n_colors),
                      (BLOCK_SIZE)((uint)iVar16 >> 0x18),CONCAT44(uVar15,uVar7));
        if (local_c0 != 0x7fffffff) {
          local_5c = local_c0 + iVar8;
LAB_00271e88:
          local_68 = ((long)local_5c * (long)*(int *)(local_10 + 0x4218) + 0x100 >> 9) +
                     local_b8 * 0x80;
          if (local_68 < *local_30) {
            *local_30 = local_68;
            memcpy(local_28,local_40,0xb0);
            memcpy(local_20,local_98,(long)(local_c4 * local_c8));
            *in_stack_00000008 = local_5c;
            *in_stack_00000018 = local_b8;
            *in_stack_00000010 = local_c0;
            *in_stack_00000020 = local_a0;
          }
        }
      }
    }
  }
  if (*(char *)((long)local_28 + 0x8f) != '\0') {
    memcpy(local_98,local_20,(long)(local_c4 * local_c8));
  }
  return;
}

Assistant:

void av1_rd_pick_palette_intra_sbuv(const AV1_COMP *cpi, MACROBLOCK *x,
                                    int dc_mode_cost,
                                    uint8_t *best_palette_color_map,
                                    MB_MODE_INFO *const best_mbmi,
                                    int64_t *best_rd, int *rate,
                                    int *rate_tokenonly, int64_t *distortion,
                                    uint8_t *skippable) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  assert(av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                           mbmi->bsize));
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  int this_rate;
  int64_t this_rd;
  int colors_u, colors_v;
  int colors_threshold_u = 0, colors_threshold_v = 0, colors_threshold = 0;
  const int src_stride = x->plane[1].src.stride;
  const uint8_t *const src_u = x->plane[1].src.buf;
  const uint8_t *const src_v = x->plane[2].src.buf;
  uint8_t *const color_map = xd->plane[1].color_index_map;
  RD_STATS tokenonly_rd_stats;
  int plane_block_width, plane_block_height, rows, cols;
  av1_get_block_dimensions(bsize, 1, xd, &plane_block_width,
                           &plane_block_height, &rows, &cols);

  mbmi->uv_mode = UV_DC_PRED;
  if (seq_params->use_highbitdepth) {
    int count_buf[1 << 12];      // Maximum (1 << 12) color levels.
    int count_buf_8bit[1 << 8];  // Maximum (1 << 8) bins for hbd path.
    av1_count_colors_highbd(src_u, src_stride, rows, cols,
                            seq_params->bit_depth, count_buf, count_buf_8bit,
                            &colors_threshold_u, &colors_u);
    av1_count_colors_highbd(src_v, src_stride, rows, cols,
                            seq_params->bit_depth, count_buf, count_buf_8bit,
                            &colors_threshold_v, &colors_v);
  } else {
    int count_buf[1 << 8];
    av1_count_colors(src_u, src_stride, rows, cols, count_buf, &colors_u);
    av1_count_colors(src_v, src_stride, rows, cols, count_buf, &colors_v);
    colors_threshold_u = colors_u;
    colors_threshold_v = colors_v;
  }

  uint16_t color_cache[2 * PALETTE_MAX_SIZE];
  const int n_cache = av1_get_palette_cache(xd, 1, color_cache);

  colors_threshold = colors_threshold_u > colors_threshold_v
                         ? colors_threshold_u
                         : colors_threshold_v;
  if (colors_threshold > 1 && colors_threshold <= 64) {
    int r, c, n, i, j;
    const int max_itr = 50;
    int lb_u, ub_u, val_u;
    int lb_v, ub_v, val_v;
    int16_t *const data = x->palette_buffer->kmeans_data_buf;
    int16_t centroids[2 * PALETTE_MAX_SIZE];

    uint16_t *src_u16 = CONVERT_TO_SHORTPTR(src_u);
    uint16_t *src_v16 = CONVERT_TO_SHORTPTR(src_v);
    if (seq_params->use_highbitdepth) {
      lb_u = src_u16[0];
      ub_u = src_u16[0];
      lb_v = src_v16[0];
      ub_v = src_v16[0];
    } else {
      lb_u = src_u[0];
      ub_u = src_u[0];
      lb_v = src_v[0];
      ub_v = src_v[0];
    }

    for (r = 0; r < rows; ++r) {
      for (c = 0; c < cols; ++c) {
        if (seq_params->use_highbitdepth) {
          val_u = src_u16[r * src_stride + c];
          val_v = src_v16[r * src_stride + c];
          data[(r * cols + c) * 2] = val_u;
          data[(r * cols + c) * 2 + 1] = val_v;
        } else {
          val_u = src_u[r * src_stride + c];
          val_v = src_v[r * src_stride + c];
          data[(r * cols + c) * 2] = val_u;
          data[(r * cols + c) * 2 + 1] = val_v;
        }
        if (val_u < lb_u)
          lb_u = val_u;
        else if (val_u > ub_u)
          ub_u = val_u;
        if (val_v < lb_v)
          lb_v = val_v;
        else if (val_v > ub_v)
          ub_v = val_v;
      }
    }

    const int colors = colors_u > colors_v ? colors_u : colors_v;
    const int max_colors =
        colors > PALETTE_MAX_SIZE ? PALETTE_MAX_SIZE : colors;
    for (n = PALETTE_MIN_SIZE; n <= max_colors; ++n) {
      for (i = 0; i < n; ++i) {
        centroids[i * 2] = lb_u + (2 * i + 1) * (ub_u - lb_u) / n / 2;
        centroids[i * 2 + 1] = lb_v + (2 * i + 1) * (ub_v - lb_v) / n / 2;
      }
      av1_k_means(data, centroids, color_map, rows * cols, n, 2, max_itr);
      optimize_palette_colors(color_cache, n_cache, n, 2, centroids,
                              cpi->common.seq_params->bit_depth);
      // Sort the U channel colors in ascending order.
      for (i = 0; i < 2 * (n - 1); i += 2) {
        int min_idx = i;
        int min_val = centroids[i];
        for (j = i + 2; j < 2 * n; j += 2)
          if (centroids[j] < min_val) min_val = centroids[j], min_idx = j;
        if (min_idx != i) {
          int temp_u = centroids[i], temp_v = centroids[i + 1];
          centroids[i] = centroids[min_idx];
          centroids[i + 1] = centroids[min_idx + 1];
          centroids[min_idx] = temp_u, centroids[min_idx + 1] = temp_v;
        }
      }
      av1_calc_indices(data, centroids, color_map, rows * cols, n, 2);
      extend_palette_color_map(color_map, cols, rows, plane_block_width,
                               plane_block_height);
      pmi->palette_size[1] = n;
      for (i = 1; i < 3; ++i) {
        for (j = 0; j < n; ++j) {
          if (seq_params->use_highbitdepth)
            pmi->palette_colors[i * PALETTE_MAX_SIZE + j] = clip_pixel_highbd(
                (int)centroids[j * 2 + i - 1], seq_params->bit_depth);
          else
            pmi->palette_colors[i * PALETTE_MAX_SIZE + j] =
                clip_pixel((int)centroids[j * 2 + i - 1]);
        }
      }

      if (cpi->sf.intra_sf.early_term_chroma_palette_size_search) {
        const int palette_mode_rate =
            intra_mode_info_cost_uv(cpi, x, mbmi, bsize, dc_mode_cost);
        const int64_t header_rd = RDCOST(x->rdmult, palette_mode_rate, 0);
        // Terminate further palette_size search, if header cost corresponding
        // to lower palette_size is more than the best_rd.
        if (header_rd >= *best_rd) break;
        av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, *best_rd);
        if (tokenonly_rd_stats.rate == INT_MAX) continue;
        this_rate = tokenonly_rd_stats.rate + palette_mode_rate;
      } else {
        av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, *best_rd);
        if (tokenonly_rd_stats.rate == INT_MAX) continue;
        this_rate = tokenonly_rd_stats.rate +
                    intra_mode_info_cost_uv(cpi, x, mbmi, bsize, dc_mode_cost);
      }

      this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
      if (this_rd < *best_rd) {
        *best_rd = this_rd;
        *best_mbmi = *mbmi;
        memcpy(best_palette_color_map, color_map,
               plane_block_width * plane_block_height *
                   sizeof(best_palette_color_map[0]));
        *rate = this_rate;
        *distortion = tokenonly_rd_stats.dist;
        *rate_tokenonly = tokenonly_rd_stats.rate;
        *skippable = tokenonly_rd_stats.skip_txfm;
      }
    }
  }
  if (best_mbmi->palette_mode_info.palette_size[1] > 0) {
    memcpy(color_map, best_palette_color_map,
           plane_block_width * plane_block_height *
               sizeof(best_palette_color_map[0]));
  }
}